

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

SListLeaf *
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListLeaf::assimilate
          (Leaf *orig)

{
  SListLeaf *pSVar1;
  SListLeaf *pSVar2;
  Node *in_RDI;
  LDIterator *in_stack_00000028;
  Leaf *in_stack_00000030;
  SListLeaf *res;
  TermList in_stack_ffffffffffffffd0;
  
  pSVar1 = (SListLeaf *)operator_new(0x3e3453);
  pSVar2 = (SListLeaf *)
           SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node::term(in_RDI);
  SListLeaf(pSVar2,in_stack_ffffffffffffffd0);
  pSVar2 = pSVar1;
  (*in_RDI->_vptr_Node[8])();
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Leaf::loadChildren
            (in_stack_00000030,in_stack_00000028);
  Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)pSVar2);
  (*in_RDI->_vptr_Node[6])();
  if (in_RDI != (Node *)0x0) {
    (*in_RDI->_vptr_Node[1])();
  }
  return pSVar1;
}

Assistant:

typename SubstitutionTree<LeafData_>::SListLeaf* SubstitutionTree<LeafData_>::SListLeaf::assimilate(Leaf* orig)
{
  SListLeaf* res=new SListLeaf(orig->term());
  res->loadChildren(orig->allChildren());
  orig->makeEmpty();
  delete orig;
  return res;
}